

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::DelAddressBook(CWallet *this,CTxDestination *address)

{
  bool bVar1;
  WalletDatabase *database;
  long in_FS_OFFSET;
  string_view process_desc;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  database = GetDatabase(this);
  local_20 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2473:87)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2473:87)>
             ::_M_manager;
  process_desc._M_str = "address book entry removal";
  process_desc._M_len = 0x1a;
  local_38._M_unused._M_object = this;
  local_38._8_8_ = address;
  bVar1 = RunWithinTxn(database,process_desc,(function<bool_(wallet::WalletBatch_&)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBook(const CTxDestination& address)
{
    return RunWithinTxn(GetDatabase(), /*process_desc=*/"address book entry removal", [&](WalletBatch& batch){
        return DelAddressBookWithDB(batch, address);
    });
}